

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Iterator __thiscall
Map<int,_int>::insert(Map<int,_int> *this,Item **cell,Item *parent,int *key,int *value)

{
  usize uVar1;
  code *pcVar2;
  int iVar3;
  ItemBlock *pIVar4;
  Item *pIVar5;
  ItemBlock *local_80;
  usize oldHeight;
  Item *insertPos;
  Item *end;
  Item *i;
  ItemBlock *itemBlock;
  Item *item;
  Item *position;
  int *value_local;
  int *key_local;
  Item *parent_local;
  Item **cell_local;
  Map<int,_int> *this_local;
  
  key_local = &parent->key;
  parent_local = (Item *)cell;
  while( true ) {
    if ((((key_local != (int *)0x0) && (parent_local != (Item *)(key_local + 4))) &&
        (parent_local != (Item *)(key_local + 6))) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pIVar5 = *(Item **)parent_local;
    if (pIVar5 == (Item *)0x0) break;
    key_local = &pIVar5->key;
    if (pIVar5->key < *key) {
      parent_local = (Item *)&pIVar5->right;
    }
    else {
      if (pIVar5->key <= *key) {
        pIVar5->value = *value;
        Iterator::Iterator((Iterator *)&this_local,pIVar5);
        return (Iterator)(Item *)this_local;
      }
      parent_local = (Item *)&pIVar5->left;
    }
  }
  itemBlock = (ItemBlock *)this->freeItem;
  if ((Item *)itemBlock == (Item *)0x0) {
    pIVar4 = (ItemBlock *)operator_new__(0x108);
    pIVar4->next = this->blocks;
    this->blocks = pIVar4;
    for (end = (Item *)(pIVar4 + 1); end < (Item *)(pIVar4 + 0x21); end = end + 1) {
      end->prev = (Item *)itemBlock;
      itemBlock = (ItemBlock *)end;
    }
    this->freeItem = (Item *)itemBlock;
  }
  Item::Item((Item *)itemBlock,(Item *)key_local,key,value);
  this->freeItem = (Item *)itemBlock[7].next;
  *(ItemBlock **)parent_local = itemBlock;
  this->_size = this->_size + 1;
  if (key_local == (int *)0x0) {
    if (((this->_begin).item != &this->endItem) &&
       (iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x1a1,"_begin.item == &endItem"), iVar3 != 0)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    itemBlock[7].next = (ItemBlock *)0x0;
    itemBlock[6].next = (ItemBlock *)(this->_begin).item;
    (this->_begin).item = (Item *)itemBlock;
    (this->endItem).prev = (Item *)itemBlock;
  }
  else {
    if (parent_local == (Item *)(key_local + 6)) {
      local_80 = *(ItemBlock **)(key_local + 0xc);
    }
    else {
      local_80 = (ItemBlock *)key_local;
    }
    pIVar4 = local_80[7].next;
    itemBlock[7].next = pIVar4;
    if (pIVar4 == (ItemBlock *)0x0) {
      (this->_begin).item = (Item *)itemBlock;
    }
    else {
      local_80[7].next[6].next = itemBlock;
    }
    itemBlock[6].next = local_80;
    local_80[7].next = itemBlock;
    do {
      uVar1 = *(usize *)(key_local + 8);
      Item::updateHeightAndSlope((Item *)key_local);
      pIVar5 = rebal(this,(Item *)key_local);
      if (uVar1 == pIVar5->height) break;
      key_local = &pIVar5->parent->key;
    } while ((Item *)key_local != (Item *)0x0);
  }
  Iterator::Iterator((Iterator *)&this_local,(Item *)itemBlock);
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }